

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BeginRendering
          (VulkanCommandBuffer *this,VkRenderingInfoKHR *RenderingInfo,size_t Hash)

{
  char (*in_RCX) [32];
  string msg;
  string local_40;
  
  if ((this->m_State).RenderPass != (VkRenderPass)0x0) {
    Diligent::FormatString<char[45]>
              (&local_40,(char (*) [45])"Another render pass has already been started");
    in_RCX = (char (*) [32])0x167;
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"BeginRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x167);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).DynamicRenderingHash != 0) {
    Diligent::FormatString<char[28]>(&local_40,(char (*) [28])"Rendering has already begun");
    in_RCX = (char (*) [32])0x168;
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"BeginRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"BeginRendering",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x169);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).DynamicRenderingHash != Hash) {
    FlushBarriers(this);
    (*vkCmdBeginRenderingKHR)(this->m_VkCmdBuffer,RenderingInfo);
    (this->m_State).DynamicRenderingHash = Hash;
  }
  return;
}

Assistant:

__forceinline void BeginRendering(const VkRenderingInfoKHR& RenderingInfo, size_t Hash)
    {
        VERIFY(m_State.RenderPass == VK_NULL_HANDLE, "Another render pass has already been started");
        VERIFY(m_State.DynamicRenderingHash == 0, "Rendering has already begun");
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);

        if (m_State.DynamicRenderingHash != Hash)
        {
            FlushBarriers();

            vkCmdBeginRenderingKHR(m_VkCmdBuffer, &RenderingInfo);
            m_State.DynamicRenderingHash = Hash;
        }
    }